

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

void __thiscall
CVmDynamicFunc::CVmDynamicFunc
          (CVmDynamicFunc *this,vm_obj_id_t self,vm_val_t *src,size_t bytecode_len,int obj_ref_cnt)

{
  vm_dynfunc_ext *this_00;
  CVmDynamicFunc *in_RCX;
  undefined8 *in_RDX;
  CVmObject *in_RDI;
  undefined4 in_R8D;
  vm_dynfunc_ext *ext;
  undefined8 in_stack_ffffffffffffffd0;
  int obj_ref_cnt_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  obj_ref_cnt_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_004428c8;
  this_00 = vm_dynfunc_ext::alloc_ext
                      (in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd8),obj_ref_cnt_00);
  in_RDI->ext_ = (char *)this_00;
  if (in_RDX != (undefined8 *)0x0) {
    *(undefined8 *)&this_00->src = *in_RDX;
    (this_00->src).val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1);
  }
  vm_dynfunc_ext::get_prefix_ptr(this_00);
  vmb_put_objid((char *)this_00,(vm_obj_id_t)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

CVmDynamicFunc::CVmDynamicFunc(VMG_ vm_obj_id_t self, const vm_val_t *src,
                               size_t bytecode_len, int obj_ref_cnt)
{
    /* allocate our extension structure */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);

    /* store it in the object */
    ext_ = (char *)ext;
    
    /* save the source value */
    if (src != 0)
        ext->src = *src;

    /* set up the code object prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);
}